

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_fwd.hpp
# Opt level: O1

region * __thiscall
toml::detail::syntax::key::scan(region *__return_storage_ptr__,key *this,location *loc)

{
  pointer psVar1;
  element_type *peVar2;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var3;
  pointer psVar4;
  bool bVar5;
  
  psVar4 = (this->scanner_).others_.
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->scanner_).others_.
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = psVar4 == psVar1;
  if (!bVar5) {
    (*((psVar4->scanner_)._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)->_vptr_scanner_base
      [2])(__return_storage_ptr__);
    peVar2 = (__return_storage_ptr__->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    while (peVar2 == (element_type *)0x0) {
      psVar4 = psVar4 + 1;
      region::~region(__return_storage_ptr__);
      bVar5 = psVar4 == psVar1;
      if (bVar5) goto LAB_003d2d28;
      _Var3._M_head_impl =
           (psVar4->scanner_)._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var3._M_head_impl)->_vptr_scanner_base[2])(__return_storage_ptr__,_Var3._M_head_impl,loc);
      peVar2 = (__return_storage_ptr__->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  }
LAB_003d2d28:
  region::region(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

region scan(location& loc) const override
    {
        return scanner_.scan(loc);
    }